

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O2

void __thiscall
Symbol_Table::set_function_data(Symbol_Table *this,string *name,string *kind,int n_args)

{
  bool bVar1;
  int iVar2;
  FunctionIdentifierData *this_00;
  mapped_type *ppFVar3;
  
  this_00 = (FunctionIdentifierData *)operator_new(0x90);
  FunctionIdentifierData::FunctionIdentifierData(this_00);
  ppFVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionIdentifierData_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionIdentifierData_*>_>_>
            ::operator[](&this->functions,name);
  *ppFVar3 = this_00;
  bVar1 = std::operator==(kind,"method");
  if (bVar1) {
    iVar2 = this->method_count;
    this->method_count = iVar2 + 1;
  }
  else {
    iVar2 = this->function_count;
    this->function_count = iVar2 + 1;
  }
  this_00->index = iVar2;
  this_00->n_args = n_args;
  std::__cxx11::string::_M_assign((string *)&this_00->kind);
  return;
}

Assistant:

void Symbol_Table::set_function_data(const std::string& name, const std::string& kind, int n_args) {
    auto* identifier_data = new FunctionIdentifierData;
    functions[name] = identifier_data;

    if (kind == "method") {
        identifier_data->index = method_count++;
    }
    else {
        identifier_data->index = function_count++;
    }
    identifier_data->n_args = n_args;
    identifier_data->kind = kind;
}